

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialize.c
# Opt level: O1

float_type init_permeability_object_2D(float_type posX,float_type posY,void *user)

{
  double dVar1;
  long lVar2;
  middle_object_2D *mo;
  
  dVar1 = *(double *)((long)user + 0x30) * 0.5;
  if ((*(double *)((long)user + 0x20) - dVar1 <= posX) &&
     (posX <= *(double *)((long)user + 0x20) + dVar1)) {
    dVar1 = *(double *)((long)user + 0x38) * 0.5;
    lVar2 = 0;
    if (*(double *)((long)user + 0x28) - dVar1 <= posY) {
      lVar2 = (ulong)(posY <= *(double *)((long)user + 0x28) + dVar1) << 3;
    }
    user = (void *)((long)user + lVar2);
  }
  return *user;
}

Assistant:

static float_type init_permeability_object_2D(float_type posX, float_type posY,
                                              void *user) {
  struct middle_object_2D *mo = (struct middle_object_2D *)user;
  if (posX < mo->object_center[0] - mo->object_dimensions[0] / float_cst(2.) ||
      posX > mo->object_center[0] + mo->object_dimensions[0] / float_cst(2.)) {
    return mo->permeability_medium;
  } else {
    if (posY <
            mo->object_center[1] - mo->object_dimensions[1] / float_cst(2.) ||
        posY >
            mo->object_center[1] + mo->object_dimensions[1] / float_cst(2.)) {
      return mo->permeability_medium;
    } else {
      return mo->permeability_object;
    }
  }
}